

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorprint.cc
# Opt level: O2

string * __thiscall
benchmark::FormatString_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,char *msg,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  unique_ptr<char[],_std::default_delete<char[]>_> buff;
  CheckHandler local_150;
  va_list args_cp;
  char local_buff [256];
  
  args_cp[0].reg_save_area = *(void **)(msg + 0x10);
  args_cp[0]._0_8_ = *(undefined8 *)msg;
  args_cp[0].overflow_arg_area = *(void **)(msg + 8);
  uVar1 = vsnprintf(local_buff,0x100,(char *)this,args_cp);
  if ((int)uVar1 < 0) {
    internal::CheckHandler::CheckHandler
              ((CheckHandler *)&buff,"ret >= 0",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/colorprint.cc"
               ,"FormatString",0x5d);
    internal::CheckHandler::~CheckHandler((CheckHandler *)&buff);
  }
  internal::GetNullLogInstance();
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else if (uVar1 < 0x100) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_buff,(allocator *)&buff);
  }
  else {
    buff._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         operator_new__((ulong)(uVar1 + 1));
    uVar2 = vsnprintf((char *)buff._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                              _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                              super__Head_base<0UL,_char_*,_false>._M_head_impl,(ulong)(uVar1 + 1),
                      (char *)this,msg);
    if (((int)uVar2 < 1) || (uVar1 < uVar2)) {
      internal::CheckHandler::CheckHandler
                (&local_150,"ret > 0 && ((size_t)ret) < size",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/colorprint.cc"
                 ,"FormatString",0x68);
      internal::CheckHandler::~CheckHandler(&local_150);
    }
    internal::GetNullLogInstance();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (char *)buff._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,(allocator *)&local_150);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buff);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const char *msg, va_list args) {
  // we might need a second shot at this, so pre-emptivly make a copy
  va_list args_cp;
  va_copy(args_cp, args);

  std::size_t size = 256;
  char local_buff[256];
  auto ret = std::vsnprintf(local_buff, size, msg, args_cp);

  va_end(args_cp);

  // currently there is no error handling for failure, so this is hack.
  CHECK(ret >= 0);

  if (ret == 0) // handle empty expansion
    return {};
  else if (static_cast<size_t>(ret) < size)
    return local_buff;
  else {
    // we did not provide a long enough buffer on our first attempt.
    size = (size_t)ret + 1; // + 1 for the null byte
    std::unique_ptr<char[]> buff(new char[size]);
    ret = std::vsnprintf(buff.get(), size, msg, args);
    CHECK(ret > 0 && ((size_t)ret) < size);
    return buff.get();
  }
}